

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

KdTreeAggregate *
pbrt::KdTreeAggregate::Create
          (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *prims,
          ParameterDictionary *parameters)

{
  int isectCost;
  int traversalCost;
  int maxPrims;
  int maxDepth;
  KdTreeAggregate *this;
  allocator<char> local_71;
  string local_70;
  Float local_4c;
  _Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"intersectcost",&local_71);
  isectCost = ParameterDictionary::GetOneInt(parameters,&local_70,0x50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"traversalcost",&local_71);
  traversalCost = ParameterDictionary::GetOneInt(parameters,&local_70,1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"emptybonus",&local_71);
  local_4c = ParameterDictionary::GetOneFloat(parameters,&local_70,0.5);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"maxprims",&local_71);
  maxPrims = ParameterDictionary::GetOneInt(parameters,&local_70,1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"maxdepth",&local_71);
  maxDepth = ParameterDictionary::GetOneInt(parameters,&local_70,-1);
  std::__cxx11::string::~string((string *)&local_70);
  this = (KdTreeAggregate *)operator_new(0x68);
  local_48._M_impl.super__Vector_impl_data._M_start =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  KdTreeAggregate(this,(vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       &local_48,isectCost,traversalCost,local_4c,maxPrims,maxDepth);
  std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~_Vector_base
            (&local_48);
  return this;
}

Assistant:

KdTreeAggregate *KdTreeAggregate::Create(std::vector<PrimitiveHandle> prims,
                                         const ParameterDictionary &parameters) {
    int isectCost = parameters.GetOneInt("intersectcost", 80);
    int travCost = parameters.GetOneInt("traversalcost", 1);
    Float emptyBonus = parameters.GetOneFloat("emptybonus", 0.5f);
    int maxPrims = parameters.GetOneInt("maxprims", 1);
    int maxDepth = parameters.GetOneInt("maxdepth", -1);
    return new KdTreeAggregate(std::move(prims), isectCost, travCost, emptyBonus,
                               maxPrims, maxDepth);
}